

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleApplicationError
          (TestErrorHandler *this,Exception *exception,Maybe<kj::HttpService::Response_&> *response)

{
  Response *pRVar1;
  undefined8 *in_RCX;
  StringPtr statusText;
  Maybe<kj::HttpService::Response_&> local_48;
  Array<char> local_40;
  StringPtr *local_28;
  long local_20;
  
  pRVar1 = response[6].ptr;
  if (pRVar1 == (Response *)0x0) {
    local_28 = (StringPtr *)0x3fdd82;
  }
  else {
    local_28 = (StringPtr *)response[5].ptr;
  }
  local_20 = (long)&pRVar1->_vptr_Response + (ulong)(pRVar1 == (Response *)0x0);
  str<char_const(&)[24],kj::StringPtr>
            ((String *)&local_40,(kj *)"Saw application error: ",(char (*) [24])&local_28,local_28);
  local_48.ptr = (Response *)*in_RCX;
  statusText.content.size_ = 0x16;
  statusText.content.ptr = "Internal Server Error";
  sendError(this,500,statusText,(String *)&local_40,&local_48);
  Array<char>::~Array(&local_40);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleApplicationError(
      kj::Exception exception, kj::Maybe<kj::HttpService::Response&> response) override {
    return sendError(500, "Internal Server Error",
        kj::str("Saw application error: ", exception.getDescription()), response);
  }